

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsGetPropertyIdFromSymbol(JsValueRef symbol,JsPropertyIdRef *propertyId)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  RecyclableObject *value;
  JavascriptSymbol *pJVar4;
  JsErrorCode exitStatus;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_003728f7;
  }
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTGetPropertyIdFromSymbol
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_38,
               symbol);
  }
  if (symbol == (JsValueRef)0x0) {
    exitStatus = JsErrorInvalidArgument;
  }
  else {
    if ((ulong)symbol >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(symbol);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003728ee;
        symbol = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (propertyId == (JsPropertyIdRef *)0x0) {
      exitStatus = JsErrorNullArgument;
    }
    else {
      *propertyId = (JsPropertyIdRef)0x0;
      bVar2 = Js::VarIs<Js::JavascriptSymbol>(symbol);
      exitStatus = JsErrorPropertyNotSymbol;
      if (bVar2) {
        pJVar4 = Js::VarTo<Js::JavascriptSymbol>(symbol);
        *propertyId = (pJVar4->propertyRecordUsageCache).propertyRecord.ptr;
        exitStatus = JsNoError;
      }
    }
  }
LAB_003728ee:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
LAB_003728f7:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_38,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsGetPropertyIdFromSymbol(_In_ JsValueRef symbol, _Out_ JsPropertyIdRef *propertyId)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetPropertyIdFromSymbol, symbol);

        VALIDATE_INCOMING_REFERENCE(symbol, scriptContext);
        PARAM_NOT_NULL(propertyId);
        *propertyId = nullptr;

        if (!Js::VarIs<Js::JavascriptSymbol>(symbol))
        {
            return JsErrorPropertyNotSymbol;
        }

        *propertyId = (JsPropertyIdRef)Js::VarTo<Js::JavascriptSymbol>(symbol)->GetValue();
        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}